

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&> * __thiscall
Catch::ExprLhs<trng::bernoulli_dist<int>const&>::operator==
          (ExprLhs<const_trng::bernoulli_dist<int>_&> *this,bernoulli_dist<int> *rhs)

{
  StringRef op;
  bool comparisonResult;
  bernoulli_dist<int> *in_RSI;
  BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&> *in_RDI;
  bernoulli_dist<int> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<trng::bernoulli_dist<int>,trng::bernoulli_dist<int>>
                 (in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = (char *)(in_RSI->P).p_;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::bernoulli_dist<int>_&,_const_trng::bernoulli_dist<int>_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }